

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

int Abc_NtkDeriveFlatGiaSop(Gia_Man_t *pGia,int *gFanins,char *pSop)

{
  uint uVar1;
  int iVar2;
  uint iLit0;
  byte bVar3;
  uint iLit1;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  
  uVar1 = Abc_SopGetVarNum(pSop);
  iVar2 = Abc_SopIsExorType(pSop);
  if (iVar2 == 0) {
    bVar3 = *pSop;
    if (bVar3 != 0) {
      uVar5 = 1;
      pcVar7 = pSop;
LAB_0086636a:
      lVar4 = 0;
      iLit0 = 1;
      do {
        if (bVar3 < 0x31) {
          if (bVar3 == 0x30) {
            if (gFanins[lVar4] < 0) goto LAB_00866408;
            iLit1 = gFanins[lVar4] ^ 1;
LAB_00866395:
            iLit0 = Gia_ManHashAnd(pGia,iLit0,iLit1);
          }
          else if ((bVar3 == 0) || (bVar3 == 0x20)) goto LAB_008663b4;
        }
        else if (bVar3 == 0x31) {
          iLit1 = gFanins[lVar4];
          goto LAB_00866395;
        }
        bVar3 = pcVar7[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while( true );
    }
  }
  else if (0 < (int)uVar1) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar5 = Gia_ManHashXor(pGia,uVar5,gFanins[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
    goto LAB_008663e4;
  }
  uVar5 = 0;
  goto LAB_008663e4;
LAB_008663b4:
  if (((int)iLit0 < 0) || (uVar5 = Gia_ManHashAnd(pGia,uVar5,iLit0 ^ 1), (int)uVar5 < 0))
  goto LAB_00866408;
  bVar3 = pcVar7[(int)(uVar1 + 3)];
  pcVar7 = pcVar7 + (int)(uVar1 + 3);
  if (bVar3 == 0) goto code_r0x008663d9;
  goto LAB_0086636a;
code_r0x008663d9:
  uVar5 = uVar5 ^ 1;
LAB_008663e4:
  iVar2 = Abc_SopIsComplement(pSop);
  if (iVar2 != 0) {
    if ((int)uVar5 < 0) {
LAB_00866408:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar5 = uVar5 ^ 1;
  }
  return uVar5;
}

Assistant:

int Abc_NtkDeriveFlatGiaSop( Gia_Man_t * pGia, int * gFanins, char * pSop )
{
    char * pCube;
    int gAnd, gSum;
    int i, Value, nFanins;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        gSum = 0; 
        for ( i = 0; i < nFanins; i++ )
            gSum = Gia_ManHashXor( pGia, gSum, gFanins[i] );
    }
    else
    {
        // go through the cubes of the node's SOP
        gSum = 0; 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            gAnd = 1;
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, gFanins[i] );
                else if ( Value == '0' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, Abc_LitNot(gFanins[i]) );
            }
            // add to the sum of cubes
            gSum = Gia_ManHashAnd( pGia, Abc_LitNot(gSum), Abc_LitNot(gAnd) );
            gSum = Abc_LitNot( gSum );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        gSum = Abc_LitNot(gSum);
    return gSum;
}